

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

matches * atomreg(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  match *res;
  int iVar2;
  matches *__ptr;
  expr *peVar3;
  expr **ppeVar4;
  
  if (ctx->reverse == 0) {
    peVar3 = printreg(ctx,a,m,(reg *)v);
    if (peVar3 == (expr *)0x0) {
      peVar3 = makeex(EXPR_NUM);
    }
    iVar2 = ctx->atomsnum;
    iVar1 = ctx->atomsmax;
    if (iVar2 < iVar1) {
      ppeVar4 = ctx->atoms;
    }
    else {
      iVar2 = 0x10;
      if (iVar1 != 0) {
        iVar2 = iVar1 * 2;
      }
      ctx->atomsmax = iVar2;
      ppeVar4 = (expr **)realloc(ctx->atoms,(long)iVar2 << 3);
      ctx->atoms = ppeVar4;
      iVar2 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar2 + 1;
    ppeVar4[iVar2] = peVar3;
  }
  else if (ctx->line->atomsnum != spos) {
    __ptr = alwaysmatches(spos + 1);
    res = __ptr->m;
    iVar2 = matchreg(res,(reg *)v,ctx->line->atoms[spos],ctx);
    if (iVar2 != 0) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomreg APROTO {
	const struct reg *reg = v;
	if (ctx->reverse) {
		if (spos == ctx->line->atomsnum)
			return 0;
		struct matches *res = alwaysmatches(spos+1);
		if (matchreg(res->m, reg, ctx->line->atoms[spos], ctx))
			return res;
		else {
			free(res->m);
			free(res);
			return 0;
		}
	}
	struct expr *expr = printreg(ctx, a, m, reg);
	if (!expr) expr = makeex(EXPR_NUM);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}